

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

char * file_stdio_ferrmsg(ALLEGRO_FILE *f)

{
  int iVar1;
  USERDATA *pUVar2;
  char *pcVar3;
  
  pUVar2 = get_userdata(f);
  if (pUVar2->errnum == 0) {
    pcVar3 = "";
  }
  else {
    iVar1 = __xpg_strerror_r(pUVar2->errnum,pUVar2->errmsg,0x50);
    pcVar3 = "";
    if (iVar1 == 0) {
      pcVar3 = pUVar2->errmsg;
    }
  }
  return pcVar3;
}

Assistant:

static const char *file_stdio_ferrmsg(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);

   if (userdata->errnum == 0)
      return "";

   /* Note: at this time MinGW has neither strerror_r nor strerror_s. */
#if defined(ALLEGRO_HAVE_STRERROR_R)
   {
      int rc = strerror_r(userdata->errnum, userdata->errmsg,
         sizeof(userdata->errmsg));
      if (rc == 0) {
         return userdata->errmsg;
      }
   }
#endif

#if defined(ALLEGRO_HAVE_STRERROR_S)
   {
      errno_t rc = strerror_s(userdata->errmsg, sizeof(userdata->errmsg),
         userdata->errnum);
      if (rc == 0) {
         return userdata->errmsg;
      }
   }
#endif

   return "";
}